

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Operation<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t *x,double *y,
          AggregateBinaryInput *binary)

{
  double *pdVar1;
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar2;
  string_t x_data;
  string_t new_value;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
    x_data.value.pointer.ptr = (char *)y;
    x_data.value._0_8_ = *(undefined8 *)&(state->arg).value;
    Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              (this,*(ArgMinMaxState<duckdb::string_t,_double> **)state,x_data,*(double *)&x->value,
               binary);
    return;
  }
  if ((*(long *)y[2] != 0) &&
     ((*(ulong *)(*(long *)y[2] + ((ulong)y[4] >> 6) * 8) >> ((ulong)y[4] & 0x3f) & 1) == 0)) {
    return;
  }
  pdVar1 = y + 1;
  if (*(long *)*pdVar1 == 0) {
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0;
  }
  else {
    y = (double *)y[3];
    AVar2 = (ArgMinMaxBase<duckdb::GreaterThan,false>)
            ((*(ulong *)(*(long *)*pdVar1 + ((ulong)y >> 6) * 8) >> ((ulong)y & 0x3f) & 1) == 0);
    this[1] = AVar2;
    if ((bool)AVar2) goto LAB_00495cdc;
  }
  new_value.value.pointer.ptr = (char *)y;
  new_value.value._0_8_ = *(undefined8 *)&(state->arg).value;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),*(string_t **)state,new_value);
LAB_00495cdc:
  *(undefined8 *)(this + 0x18) = *(undefined8 *)&x->value;
  *this = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}